

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.cpp
# Opt level: O2

decimal * simdjson::internal::parse_decimal(decimal *__return_storage_ptr__,char **p)

{
  int iVar1;
  byte *pbVar2;
  byte *pbVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  byte bVar8;
  int iVar9;
  
  __return_storage_ptr__->decimal_point = 0;
  __return_storage_ptr__->truncated = false;
  pbVar2 = (byte *)*p;
  bVar8 = *pbVar2;
  __return_storage_ptr__->negative = bVar8 == 0x2d;
  if ((bVar8 != 0x2d) && (bVar8 != 0x2b)) goto LAB_0013cd62;
  do {
    pbVar2 = pbVar2 + 1;
    *p = (char *)pbVar2;
LAB_0013cd62:
    bVar8 = *pbVar2;
  } while (bVar8 == 0x30);
  uVar4 = ~(uint)pbVar2;
  uVar7 = 0;
  while( true ) {
    pbVar3 = pbVar2 + 1;
    uVar6 = (uint)uVar7;
    if (9 < (byte)(bVar8 - 0x30)) break;
    if (uVar6 < 0x300) {
      __return_storage_ptr__->digits[uVar7] = bVar8 - 0x30;
    }
    uVar7 = (ulong)(uVar6 + 1);
    *p = (char *)pbVar3;
    bVar8 = *pbVar3;
    uVar4 = uVar4 - 1;
    pbVar2 = pbVar3;
  }
  __return_storage_ptr__->num_digits = uVar6;
  if (bVar8 == 0x2e) {
    *p = (char *)pbVar3;
    if (uVar6 == 0) {
      while (*pbVar3 == 0x30) {
        pbVar3 = pbVar3 + 1;
        *p = (char *)pbVar3;
      }
    }
    iVar5 = -(uVar4 + (int)pbVar3);
    while( true ) {
      uVar6 = (uint)uVar7;
      if (9 < (byte)(*pbVar3 - 0x30)) break;
      if (uVar6 < 0x300) {
        __return_storage_ptr__->digits[uVar7] = *pbVar3 - 0x30;
      }
      uVar7 = (ulong)(uVar6 + 1);
      pbVar3 = pbVar3 + 1;
      *p = (char *)pbVar3;
      iVar5 = iVar5 + -1;
    }
    __return_storage_ptr__->num_digits = uVar6;
    __return_storage_ptr__->decimal_point = iVar5;
    pbVar2 = pbVar3;
  }
  else {
    iVar5 = 0;
  }
  if (uVar6 != 0) {
    iVar9 = 0;
    pbVar3 = pbVar2;
    while( true ) {
      pbVar3 = pbVar3 + -1;
      bVar8 = *pbVar3;
      if ((bVar8 != 0x30) && (bVar8 != 0x2e)) break;
      iVar9 = iVar9 + (uint)(bVar8 == 0x30);
    }
    iVar5 = iVar5 + uVar6;
    __return_storage_ptr__->decimal_point = iVar5;
    __return_storage_ptr__->num_digits = uVar6 - iVar9;
    if (0x300 < uVar6 - iVar9) {
      __return_storage_ptr__->num_digits = 0x300;
      __return_storage_ptr__->truncated = true;
    }
  }
  if ((*pbVar2 | 0x20) == 0x65) {
    pbVar3 = pbVar2 + 1;
    *p = (char *)pbVar3;
    bVar8 = pbVar2[1];
    if ((bVar8 != 0x2d) && (iVar9 = 0, bVar8 != 0x2b)) goto LAB_0013ce6c;
    pbVar3 = pbVar2 + 2;
    iVar9 = 0;
    while( true ) {
      *p = (char *)pbVar3;
LAB_0013ce6c:
      if (9 < (byte)(*pbVar3 - 0x30)) break;
      if (iVar9 < 0x10000) {
        iVar9 = (uint)(byte)(*pbVar3 - 0x30) + iVar9 * 10;
      }
      pbVar3 = pbVar3 + 1;
    }
    iVar1 = -iVar9;
    if (bVar8 != 0x2d) {
      iVar1 = iVar9;
    }
    __return_storage_ptr__->decimal_point = iVar5 + iVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

decimal parse_decimal(const char *&p) noexcept {
  decimal answer;
  answer.num_digits = 0;
  answer.decimal_point = 0;
  answer.truncated = false;
  answer.negative = (*p == '-');
  if ((*p == '-') || (*p == '+')) {
    ++p;
  }

  while (*p == '0') {
    ++p;
  }
  while (is_integer(*p)) {
    if (answer.num_digits < max_digits) {
      answer.digits[answer.num_digits] = uint8_t(*p - '0');
    }
    answer.num_digits++;
    ++p;
  }
  if (*p == '.') {
    ++p;
    const char *first_after_period = p;
    // if we have not yet encountered a zero, we have to skip it as well
    if (answer.num_digits == 0) {
      // skip zeros
      while (*p == '0') {
        ++p;
      }
    }
    while (is_integer(*p)) {
      if (answer.num_digits < max_digits) {
        answer.digits[answer.num_digits] = uint8_t(*p - '0');
      }
      answer.num_digits++;
      ++p;
    }
    answer.decimal_point = int32_t(first_after_period - p);
  }
  if(answer.num_digits > 0) {
    const char *preverse = p - 1;
    int32_t trailing_zeros = 0;
    while ((*preverse == '0') || (*preverse == '.')) {
      if(*preverse == '0') { trailing_zeros++; };
      --preverse;
    }
    answer.decimal_point += int32_t(answer.num_digits);
    answer.num_digits -= uint32_t(trailing_zeros);
  }
  if(answer.num_digits > max_digits ) {
    answer.num_digits = max_digits;
    answer.truncated = true;
  }
  if (('e' == *p) || ('E' == *p)) {
    ++p;
    bool neg_exp = false;
    if ('-' == *p) {
      neg_exp = true;
      ++p;
    } else if ('+' == *p) {
      ++p;
    }
    int32_t exp_number = 0; // exponential part
    while (is_integer(*p)) {
      uint8_t digit = uint8_t(*p - '0');
      if (exp_number < 0x10000) {
        exp_number = 10 * exp_number + digit;
      }
      ++p;
    }
    answer.decimal_point += (neg_exp ? -exp_number : exp_number);
  }
  return answer;
}